

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjLookupTable::add_undo_rec
          (CVmObjLookupTable *this,vm_obj_id_t self,lookuptab_undo_action action,vm_val_t *key,
          vm_val_t *old_entry_val)

{
  int iVar1;
  CVmUndoMeta *__ptr;
  CVmUndoMeta *in_RCX;
  vm_obj_id_t in_EDX;
  CVmUndoMeta *in_R8;
  vm_val_t nil_val;
  lookuptab_undo_rec *rec;
  vm_val_t *in_stack_ffffffffffffffc8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  CVmUndoMeta *local_18;
  
  __ptr = (CVmUndoMeta *)malloc(0x18);
  vm_val_t::set_nil((vm_val_t *)&stack0xffffffffffffffc8);
  local_18 = in_RCX;
  if (in_RCX == (CVmUndoMeta *)0x0) {
    local_18 = (CVmUndoMeta *)&stack0xffffffffffffffc8;
  }
  if (in_R8 == (CVmUndoMeta *)0x0) {
    in_R8 = (CVmUndoMeta *)&stack0xffffffffffffffc8;
  }
  (__ptr->rec).obj = in_EDX;
  (__ptr->link).next_first = (local_18->link).prev_first;
  *(CVmUndoMeta **)&(__ptr->rec).oldval = (local_18->link).next_first;
  iVar1 = CVmUndo::add_new_record_ptr_key
                    ((CVmUndo *)&in_R8->link,(vm_obj_id_t)((ulong)__ptr >> 0x20),
                     in_stack_ffffffffffffffd0.ptr,in_stack_ffffffffffffffc8);
  if (iVar1 == 0) {
    free(__ptr);
  }
  return;
}

Assistant:

void CVmObjLookupTable::add_undo_rec(VMG_ vm_obj_id_t self,
                                     lookuptab_undo_action action,
                                     const vm_val_t *key,
                                     const vm_val_t *old_entry_val)
{
    lookuptab_undo_rec *rec;
    vm_val_t nil_val;

    /* allocate our record extension */
    rec = (lookuptab_undo_rec *)t3malloc(sizeof(lookuptab_undo_rec));

    /* if either the key or old value are null pointers, use a nil value */
    nil_val.set_nil();
    if (key == 0)
        key = &nil_val;
    if (old_entry_val == 0)
        old_entry_val = &nil_val;

    /* set up the record */
    rec->action = action;
    rec->key = *key;

    /* add the record to the global undo stream */
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec, old_entry_val))
    {
        /* 
         *   we didn't add an undo record, so our extra undo information
         *   isn't actually going to be stored in the undo system - hence we
         *   must delete our extra information 
         */
        t3free(rec);
    }
}